

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::internal::GenerateEnumData
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          internal *this,Span<const_int> values)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  pointer piVar4;
  iterator iVar5;
  pointer piVar6;
  Nonnull<const_char_*> pcVar7;
  pointer piVar8;
  uint uVar9;
  uint *unaff_RBX;
  internal *piVar10;
  int *piVar11;
  uint unaff_EBP;
  long lVar12;
  pointer piVar13;
  pointer piVar14;
  unsigned_long uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t __n;
  ulong uVar18;
  vector<int,_std::allocator<int>_> fallback_values;
  vector<int,_std::allocator<int>_> fallback_values_after_bitmap;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmap_values;
  vector<int,_std::allocator<int>_> fallback_values_too_large;
  ushort local_fa;
  vector<int,_std::allocator<int>_> local_f8;
  int *local_d8;
  iterator iStack_d0;
  int *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  int *local_98;
  iterator iStack_90;
  int *local_88;
  EytzingerLayoutSorter local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  internal *local_40;
  internal *local_38;
  
  piVar8 = values.ptr_;
  piVar6 = (pointer)((long)piVar8 + (ulong)(piVar8 == (pointer)0x0));
  piVar13 = (pointer)0x0;
  do {
    piVar14 = piVar6;
    if ((pointer)((long)piVar6 - 1U) == piVar13) break;
    piVar14 = (pointer)((long)piVar13 + 1);
    lVar12 = (long)piVar13 * 4;
    lVar2 = (long)piVar13 * 4;
    piVar13 = piVar14;
  } while (*(int *)(this + lVar12) < *(int *)(this + lVar2 + 4));
  if (piVar14 < piVar8) {
    GenerateEnumData((internal *)&local_78);
  }
  else {
    local_98 = (int *)0x0;
    iStack_90._M_current = (int *)0x0;
    piVar10 = (internal *)0x0;
    local_88 = (int *)0x0;
    local_c8 = (int *)0x0;
    local_d8 = (int *)0x0;
    iStack_d0._M_current = (int *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    unaff_EBP = 0;
    local_50 = __return_storage_ptr__;
    if (piVar8 != (pointer)0x0) {
      local_38 = this + (long)piVar8 * 4;
      local_48 = 0;
      piVar10 = (internal *)0x0;
      do {
        iVar3 = *(int *)this;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar3);
        if ((local_48 & 1) == 0) {
          if ((short)(ushort)iVar3 == iVar3) {
            local_48 = CONCAT71((uint7)(uint3)(int3)(char)((uint)iVar3 >> 8),1);
            piVar10 = (internal *)0x1;
            local_fa = (ushort)iVar3;
          }
          else if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,(int *)&local_f8);
          }
          else {
            *iStack_90._M_current = iVar3;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        else {
          uVar9 = (uint)piVar10;
          if ((uVar9 < 0xffff) && (iVar3 == (int)(short)local_fa + uVar9)) {
            piVar10 = (internal *)(ulong)(uVar9 + 1);
          }
          else {
            lVar12 = ((ulong)piVar10 & 0xffffffff) + (long)(short)local_fa;
            uVar18 = iVar3 - lVar12;
            if ((long)uVar18 < 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_78,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                         ,0x8a,"a >= 0");
              goto LAB_0029b78c;
            }
            uVar9 = (uint)uVar18;
            if (uVar18 >> 0x20 == 0) {
              pcVar7 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (uVar18,uVar18 & 0xffffffff,"a == static_cast<uint32_t>(a)");
            }
            if (pcVar7 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_78,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                         ,0x8b,pcVar7);
              goto LAB_0029b78c;
            }
            uVar16 = uVar18 & 0xffffffff;
            uVar17 = ((long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) * 8;
            if (uVar17 < uVar16 || uVar17 - uVar16 == 0) {
              if (uVar9 < 0xffe0) {
                uVar15 = (long)local_b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                uVar17 = uVar16 + 0x20 >> 5;
                if (uVar17 <= uVar15 + ((long)iStack_d0._M_current - (long)local_d8 >> 2) + 1) {
                  if (uVar15 < uVar17) {
                    pcVar7 = (Nonnull<const_char_*>)0x0;
                  }
                  else {
                    pcVar7 = absl::lts_20250127::log_internal::
                             MakeCheckOpString<unsigned_long,unsigned_long>
                                       (uVar17,uVar15,"rounded_bitmap_size > bitmap_values.size()");
                  }
                  if (pcVar7 == (Nonnull<const_char_*>)0x0) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              (&local_b8,uVar17);
                    iVar5._M_current = iStack_d0._M_current;
                    local_40 = piVar10;
                    for (piVar11 = local_d8; piVar11 != iVar5._M_current; piVar11 = piVar11 + 1) {
                      uVar17 = *piVar11 - lVar12;
                      if ((long)uVar17 < 0) {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)&local_78,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                                   ,0x8a,"a >= 0");
                        goto LAB_0029b78c;
                      }
                      if (uVar17 >> 0x20 == 0) {
                        pcVar7 = (Nonnull<const_char_*>)0x0;
                      }
                      else {
                        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                           (uVar17,uVar17 & 0xffffffff,
                                            "a == static_cast<uint32_t>(a)");
                      }
                      if (pcVar7 != (Nonnull<const_char_*>)0x0) {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)&local_78,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                                   ,0x8b,pcVar7);
                        goto LAB_0029b78c;
                      }
                      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17 >> 5 & 0x7ffffff] =
                           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar17 >> 5 & 0x7ffffff] |
                           1 << ((byte)uVar17 & 0x1f);
                    }
                    if (iStack_d0._M_current != local_d8) {
                      iStack_d0._M_current = local_d8;
                    }
                    puVar1 = (uint *)((long)local_b8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     (ulong)(uVar9 >> 3 & 0x1ffc));
                    *puVar1 = *puVar1 | 1 << ((byte)uVar18 & 0x1f);
                    piVar10 = local_40;
                    __return_storage_ptr__ = local_50;
                    goto LAB_0029b494;
                  }
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_78,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                             ,0xa9,pcVar7);
                  goto LAB_0029b78c;
                }
              }
              if (iStack_d0._M_current == local_c8) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,(int *)&local_f8);
              }
              else {
                *iStack_d0._M_current =
                     (int)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iStack_d0._M_current = iStack_d0._M_current + 1;
              }
            }
            else {
              if ((long)iStack_d0._M_current - (long)local_d8 == 0) {
                pcVar7 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                                   ((long)iStack_d0._M_current - (long)local_d8 >> 2,0,
                                    "fallback_values_after_bitmap.size() == 0");
              }
              if (pcVar7 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_78,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                           ,0x98,pcVar7);
                goto LAB_0029b78c;
              }
              local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9 >> 5] =
                   local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9 >> 5] | 1 << ((byte)uVar18 & 0x1f);
            }
          }
        }
LAB_0029b494:
        this = this + 4;
      } while (this != local_38);
      unaff_EBP = 0;
      if ((local_48 & 1) != 0) {
        unaff_EBP = (uint)local_fa;
      }
    }
    uVar9 = (uint)piVar10;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (local_d8 == iStack_d0._M_current) {
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_98;
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iStack_90._M_current;
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98 = (int *)0x0;
      iStack_90._M_current = (int *)0x0;
      local_88 = (int *)0x0;
    }
    else if (local_98 == iStack_90._M_current) {
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_d8;
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iStack_d0._M_current;
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_c8;
      local_d8 = (int *)0x0;
      iStack_d0._M_current = (int *)0x0;
      local_c8 = (int *)0x0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize
                (&local_f8,
                 ((long)iStack_d0._M_current - (long)local_d8 >> 2) +
                 ((long)iStack_90._M_current - (long)local_98 >> 2));
      std::
      __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,__gnu_cxx::__ops::_Iter_less_iter>
                (local_98,iStack_90._M_current,local_d8,iStack_d0._M_current,
                 local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               ((long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) +
               ((long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 2,(allocator_type *)&local_78);
    unaff_RBX = (__return_storage_ptr__->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    this = piVar10;
    if (uVar9 < 0x10000) {
      pcVar7 = (Nonnull<const_char_*>)0x0;
      goto LAB_0029b620;
    }
  }
  uVar9 = (uint)this;
  pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((ulong)this & 0xffffffff,(ulong)this & 0xffff,
                      "sequence_length == static_cast<uint16_t>(sequence_length)");
LAB_0029b620:
  if (pcVar7 == (Nonnull<const_char_*>)0x0) {
    *unaff_RBX = unaff_EBP | uVar9 << 0x10;
    uVar15 = ((long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 8;
    uVar18 = (ulong)((uint)uVar15 & 0xffe0);
    if (uVar15 == uVar18) {
      pcVar7 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                         (uVar15,uVar18,
                          "kBitmapBlockSize * bitmap_values.size() == static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size())"
                         );
    }
    if (pcVar7 == (Nonnull<const_char_*>)0x0) {
      uVar15 = (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar15 < 0x10000) {
        pcVar7 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                           (uVar15,uVar15 & 0xffff,
                            "fallback_values.size() == static_cast<uint16_t>(fallback_values.size())"
                           );
      }
      piVar4 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar7 == (Nonnull<const_char_*>)0x0) {
        unaff_RBX[1] = ((int)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                        (int)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start & 0xfffffffcU) << 0xe |
                       ((int)local_b8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (int)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start) * 8 & 0xffffffe0U;
        __n = (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
        if (__n != 0) {
          memmove(unaff_RBX + 2,
                  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,__n);
        }
        local_78.output.ptr_ = (pointer)((long)(unaff_RBX + 2) + __n);
        local_78.input.len_ =
             (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
        local_78.input.ptr_ = piVar4;
        local_78.i = 0;
        local_78.output.len_ = local_78.input.len_;
        EytzingerLayoutSorter::Sort(&local_78,0);
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8 != (int *)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        if (local_98 != (int *)0x0) {
          operator_delete(local_98,(long)local_88 - (long)local_98);
        }
        return __return_storage_ptr__;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                 ,0xcf,pcVar7);
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                 ,0xcd,pcVar7);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,200,pcVar7);
  }
LAB_0029b78c:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

std::vector<uint32_t> GenerateEnumData(absl::Span<const int32_t> values) {
  const auto sorted_and_unique = [&] {
    for (size_t i = 0; i + 1 < values.size(); ++i) {
      if (values[i] >= values[i + 1]) return false;
    }
    return true;
  };
  ABSL_DCHECK(sorted_and_unique());
  std::vector<int32_t> fallback_values_too_large, fallback_values_after_bitmap;
  std::vector<uint32_t> bitmap_values;
  constexpr size_t kBitmapBlockSize = 32;
  absl::optional<int16_t> start_sequence;
  uint32_t sequence_length = 0;
  for (int32_t v : values) {
    // If we don't yet have a sequence, start it.
    if (!start_sequence.has_value()) {
      // But only if we can fit it in the sequence.
      if (static_cast<int16_t>(v) != v) {
        fallback_values_too_large.push_back(v);
        continue;
      }

      start_sequence = v;
      sequence_length = 1;
      continue;
    }
    // If we can extend the sequence, do so.
    if (v == static_cast<int32_t>(*start_sequence) +
                 static_cast<int32_t>(sequence_length) &&
        sequence_length < 0xFFFF) {
      ++sequence_length;
      continue;
    }

    // We adjust the bitmap values to be relative to the end of the sequence.
    const auto adjust = [&](int32_t v) -> uint32_t {
      // Cast to int64_t first to avoid overflow. The result is guaranteed to be
      // positive and fit in uint32_t.
      int64_t a = static_cast<int64_t>(v) - *start_sequence - sequence_length;
      ABSL_DCHECK(a >= 0);
      ABSL_DCHECK_EQ(a, static_cast<uint32_t>(a));
      return a;
    };
    const uint32_t adjusted = adjust(v);

    const auto add_bit = [&](uint32_t bit) {
      bitmap_values[bit / kBitmapBlockSize] |= uint32_t{1}
                                               << (bit % kBitmapBlockSize);
    };

    // If we can fit it on the already allocated bitmap, do so.
    if (adjusted < kBitmapBlockSize * bitmap_values.size()) {
      // We can fit it in the existing bitmap.
      ABSL_DCHECK_EQ(fallback_values_after_bitmap.size(), 0);
      add_bit(adjusted);
      continue;
    }

    // We can't fit in the sequence and we can't fit in the current bitmap.
    // Evaluate if it is better to add to fallback, or to collapse all the
    // fallback values after the bitmap into the bitmap.
    const size_t cost_if_fallback =
        bitmap_values.size() + (1 + fallback_values_after_bitmap.size());
    const size_t rounded_bitmap_size =
        (adjusted + kBitmapBlockSize) / kBitmapBlockSize;
    const size_t cost_if_collapse = rounded_bitmap_size;

    if (cost_if_collapse <= cost_if_fallback &&
        kBitmapBlockSize * rounded_bitmap_size < 0x10000) {
      // Collapse the existing values, and add the new one.
      ABSL_DCHECK_GT(rounded_bitmap_size, bitmap_values.size());
      bitmap_values.resize(rounded_bitmap_size);
      for (int32_t to_collapse : fallback_values_after_bitmap) {
        add_bit(adjust(to_collapse));
      }
      fallback_values_after_bitmap.clear();
      add_bit(adjusted);
    } else {
      fallback_values_after_bitmap.push_back(v);
    }
  }

  std::vector<int32_t> fallback_values;
  if (fallback_values_after_bitmap.empty()) {
    fallback_values = std::move(fallback_values_too_large);
  } else if (fallback_values_too_large.empty()) {
    fallback_values = std::move(fallback_values_after_bitmap);
  } else {
    fallback_values.resize(fallback_values_too_large.size() +
                           fallback_values_after_bitmap.size());
    std::merge(fallback_values_too_large.begin(),
               fallback_values_too_large.end(),
               fallback_values_after_bitmap.begin(),
               fallback_values_after_bitmap.end(), &fallback_values[0]);
  }

  std::vector<uint32_t> output(
      2 /* seq start + seq len + bitmap len + ordered len */ +
      bitmap_values.size() + fallback_values.size());
  uint32_t* p = output.data();

  ABSL_DCHECK_EQ(sequence_length, static_cast<uint16_t>(sequence_length));
  *p++ = uint32_t{static_cast<uint16_t>(start_sequence.value_or(0))} |
         (uint32_t{sequence_length} << 16);
  ABSL_DCHECK_EQ(
      kBitmapBlockSize * bitmap_values.size(),
      static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size()));
  ABSL_DCHECK_EQ(fallback_values.size(),
                 static_cast<uint16_t>(fallback_values.size()));
  *p++ = static_cast<uint32_t>(kBitmapBlockSize * bitmap_values.size()) |
         static_cast<uint32_t>(fallback_values.size() << 16);
  p = std::copy(bitmap_values.begin(), bitmap_values.end(), p);

  EytzingerLayoutSorter{fallback_values,
                        absl::MakeSpan(p, fallback_values.size())}
      .Sort();

  return output;
}